

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall
tetgenmesh::scoutsubface(tetgenmesh *this,face *searchsh,triface *searchtet,int shflag)

{
  uint uVar1;
  int iVar2;
  interresult iVar3;
  point pdVar4;
  point endpt;
  point pdVar5;
  undefined1 local_60 [8];
  triface spintet;
  point pc;
  int t1ver;
  interresult dir;
  point pb;
  point pa;
  int shflag_local;
  triface *searchtet_local;
  face *searchsh_local;
  tetgenmesh *this_local;
  
  pdVar4 = sorg(this,searchsh);
  endpt = sdest(this,searchsh);
  point2tetorg(this,pdVar4,searchtet);
  iVar3 = finddirection(this,searchtet,endpt);
  if (iVar3 == ACROSSVERT) {
    pdVar5 = dest(this,searchtet);
    if (pdVar5 != endpt) {
      if (shflag == 0) {
        terminatetetgen(this,2);
      }
      else {
        report_selfint_edge(this,pdVar4,endpt,searchsh,searchtet,ACROSSVERT);
      }
    }
    spintet._8_8_ = sapex(this,searchsh);
    local_60 = (undefined1  [8])searchtet->tet;
    spintet.tet = *(tetrahedron **)&searchtet->ver;
    do {
      pdVar4 = apex(this,(triface *)local_60);
      if (pdVar4 == (point)spintet._8_8_) {
        if ((*(tetrahedron *)((long)local_60 + 0x48) == (tetrahedron)0x0) ||
           ((*(tetrahedron *)((long)local_60 + 0x48))[(int)((uint)spintet.tet & 3)] == (double *)0x0
           )) {
          tsbond(this,(triface *)local_60,searchsh);
          uVar1 = (uint)spintet.tet;
          decode(this,*(tetrahedron *)((long)local_60 + (long)(int)((uint)spintet.tet & 3) * 8),
                 (triface *)local_60);
          spintet.tet = (tetrahedron *)
                        CONCAT44(spintet.tet._4_4_,fsymtbl[(int)uVar1][(int)(uint)spintet.tet]);
          sesymself(this,searchsh);
          tsbond(this,(triface *)local_60,searchsh);
          triface::operator=(searchtet,(triface *)local_60);
          return 1;
        }
        terminatetetgen(this,2);
      }
      iVar2 = (uint)spintet.tet;
      decode(this,*(tetrahedron *)((long)local_60 + (long)facepivot1[(int)(uint)spintet.tet] * 8),
             (triface *)local_60);
      spintet.tet = (tetrahedron *)
                    CONCAT44(spintet.tet._4_4_,facepivot2[iVar2][(int)(uint)spintet.tet]);
    } while (local_60 != (undefined1  [8])searchtet->tet);
  }
  return 0;
}

Assistant:

int tetgenmesh::scoutsubface(face* searchsh, triface* searchtet, int shflag)
{
  point pa = sorg(*searchsh);
  point pb = sdest(*searchsh);

  // Get a tet whose origin is a.
  point2tetorg(pa, *searchtet);
  // Search the edge [a,b].
  enum interresult dir = finddirection(searchtet, pb);
  if (dir == ACROSSVERT) {
    // Check validity of a PLC.
    if (dest(*searchtet) != pb) {
	  if (shflag) {
        // A vertex lies on the search edge. 
	    report_selfint_edge(pa, pb, searchsh, searchtet, dir);
	  } else {
	    terminatetetgen(this, 2);
	  }
    }
	int t1ver;
    // The edge exists. Check if the face exists.
    point pc = sapex(*searchsh);
    // Searchtet holds edge [a,b]. Search a face with apex c.
    triface spintet = *searchtet;
    while (1) {
      if (apex(spintet) == pc) {
        // Found a face matching to 'searchsh'!
        if (!issubface(spintet)) {
          // Insert 'searchsh'.
          tsbond(spintet, *searchsh);
          fsymself(spintet);
          sesymself(*searchsh);
          tsbond(spintet, *searchsh);
          *searchtet = spintet;
          return 1; 
        } else {
          terminatetetgen(this, 2);
        }
      }
      fnextself(spintet);
      if (spintet.tet == searchtet->tet) break;
    }
  }

  return 0;
}